

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O1

void __thiscall
EVPTest_WycheproofRSAOAEP2048_Test::TestBody(EVPTest_WycheproofRSAOAEP2048_Test *this)

{
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_2048_sha1_mgf1sha1_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_2048_sha224_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_2048_sha224_mgf1sha224_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_2048_sha256_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_2048_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_2048_sha384_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_2048_sha384_mgf1sha384_test.txt");
  RunWycheproofOAEPTest("third_party/wycheproof_testvectors/rsa_oaep_2048_sha512_mgf1sha1_test.txt")
  ;
  RunWycheproofOAEPTest
            ("third_party/wycheproof_testvectors/rsa_oaep_2048_sha512_mgf1sha512_test.txt");
  return;
}

Assistant:

TEST(EVPTest, WycheproofRSAOAEP2048) {
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha1_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha224_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha224_mgf1sha224_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha256_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha256_mgf1sha256_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha384_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha384_mgf1sha384_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha512_mgf1sha1_test.txt");
  RunWycheproofOAEPTest(
      "third_party/wycheproof_testvectors/"
      "rsa_oaep_2048_sha512_mgf1sha512_test.txt");
}